

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O2

RGBColor __thiscall pm::Matte::pathShade(Matte *this,ShadeRecord *sr)

{
  undefined8 uVar1;
  float fVar2;
  Vector3 *in_RDX;
  undefined1 auVar3 [16];
  float fVar4;
  RGBColor RVar5;
  float pdf;
  RGBColor f;
  undefined1 local_88 [8];
  float local_80;
  undefined1 local_78 [16];
  Vector3 local_68;
  float local_58;
  float fStack_54;
  float local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  
  local_58 = 0.0;
  fStack_54 = 0.0;
  local_50 = 0.0;
  local_68.z = -in_RDX[6].x;
  local_68.x = in_RDX[5].y;
  local_68.y = in_RDX[5].z;
  local_68._0_8_ = local_68._0_8_ ^ 0x8000000080000000;
  Lambertian::sampleF((Lambertian *)local_78,(ShadeRecord *)&(sr->ray).d,in_RDX,&local_68,&local_58)
  ;
  fVar2 = local_50;
  local_38 = CONCAT44(local_50,fStack_54);
  local_48 = in_RDX[1].y;
  fStack_44 = in_RDX[1].z;
  fStack_40 = in_RDX[2].x;
  fStack_3c = local_58;
  fVar4 = local_50 * in_RDX[4].x + in_RDX[3].y * local_58 + in_RDX[3].z * fStack_54;
  uVar1._0_4_ = in_RDX[8].x;
  uVar1._4_4_ = in_RDX[8].y;
  (**(code **)(**(long **)&in_RDX[8].z + 0x18))
            (local_88,*(long **)&in_RDX[8].z,uVar1,&local_48,(int)in_RDX[6].y + 1);
  RVar5.r = ((float)local_78._8_4_ * local_80 * fVar4) / 0.0;
  auVar3._0_4_ = fVar4 * local_88._0_4_ * (float)local_78._0_8_;
  auVar3._4_4_ = fVar4 * local_88._4_4_ * SUB84(local_78._0_8_,4);
  auVar3._8_4_ = fVar2 * 0.0;
  auVar3._12_4_ = fVar2 * 0.0;
  auVar3 = divps(auVar3,ZEXT816(0));
  (this->super_Material)._vptr_Material = auVar3._0_8_;
  (this->super_Material).type_ = (Type)RVar5.r;
  RVar5.g = 0.0;
  RVar5.b = 0.0;
  return RVar5;
}

Assistant:

RGBColor Matte::pathShade(ShadeRecord &sr) const
{
	Vector3 wi;
	const Vector3 wo = -sr.ray.d;
	float pdf = 0.0f;
	const RGBColor f = diffuseBrdf_.sampleF(sr, wo, wi, pdf);
	const float nDotWi = dot(sr.normal, wi);
	const Ray reflectedRay(sr.hitPoint, wi);

	return (f * sr.tracer.traceRay(sr.world, reflectedRay, sr.depth + 1) * nDotWi / pdf);
}